

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O2

void __thiscall
Js::DiagNativeStackFrame::SetRegValue(DiagNativeStackFrame *this,RegSlot slotId,Var value)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Var *ppvVar5;
  undefined4 *puVar6;
  
  ppvVar5 = GetSlotOffsetLocation(this,slotId,false);
  if (ppvVar5 == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x236,"(varPtr != __null)","varPtr != NULL");
    if (!bVar3) goto LAB_007fb5f8;
    *puVar6 = 0;
  }
  *ppvVar5 = value;
  iVar4 = this->m_localVarChangedOffset;
  if (iVar4 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x23b,"(m_localVarChangedOffset != InvalidOffset)",
                                "m_localVarChangedOffset != InvalidOffset");
    if (!bVar3) goto LAB_007fb5f8;
    *puVar6 = 0;
    iVar4 = this->m_localVarChangedOffset;
  }
  pvVar1 = this->m_stackAddr;
  if (1 < *(byte *)((long)pvVar1 + (long)iVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x240,
                                "(*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue)"
                                ,
                                "*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue"
                               );
    if (!bVar3) {
LAB_007fb5f8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  *(undefined1 *)((long)pvVar1 + (long)iVar4) = 1;
  return;
}

Assistant:

void DiagNativeStackFrame::SetRegValue(RegSlot slotId, Var value)
    {
        Js::Var *varPtr = GetSlotOffsetLocation(slotId);
        Assert(varPtr != NULL);

        // First assign the value
        *varPtr = value;

        Assert(m_localVarChangedOffset != InvalidOffset);

        // Now change the bit in the stack which tells that current stack values got changed.
        char *stackOffset = (((char *)m_stackAddr) + m_localVarChangedOffset);

        Assert(*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue);

        *stackOffset = FunctionBody::LocalsChangeDirtyValue;
    }